

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTransform.h
# Opt level: O2

void __thiscall
xmrig::BaseTransform::set<bool>(BaseTransform *this,Document *doc,char *objKey,char *key,bool value)

{
  bool bVar1;
  size_t sVar2;
  Type obj;
  StringRefType local_40;
  
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(&doc->
                       super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ,objKey);
  if (!bVar1) {
    local_40.s = objKey;
    sVar2 = strlen(objKey);
    local_40.length = (SizeType)sVar2;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<rapidjson::Type>
              (&doc->
                super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ,&local_40,kObjectType,doc->allocator_);
  }
  obj = rapidjson::
        GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
        ::operator[]<char_const>
                  ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    *)doc,objKey);
  set<bool>(this,doc,obj,key,value);
  return;
}

Assistant:

inline void set(rapidjson::Document &doc, const char *objKey, const char *key, T value)
    {
        if (!doc.HasMember(objKey)) {
            doc.AddMember(rapidjson::StringRef(objKey), rapidjson::kObjectType, doc.GetAllocator());
        }

        set<T>(doc, doc[objKey], key, value);
    }